

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::PrepareNames(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  cmValue cVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  cmValue cVar8;
  uint uVar9;
  string_view algo;
  allocator<char> local_60d;
  uint local_60c;
  char *local_608 [4];
  string tempDirectory;
  ostringstream cmCPackLog_msg;
  uint auStack_5a8 [122];
  string outName;
  ostringstream ostr;
  string destFile;
  string topDirectory;
  string line;
  string outFile;
  ostringstream cmCPackLog_msg_10;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Create temp directory.");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3c,_ostr);
  std::__cxx11::string::~string((string *)&ostr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_SET_DESTDIR",(allocator<char> *)&ostr);
  bVar3 = IsOn(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (bVar3) {
    iVar4 = (*this->_vptr_cmCPackGenerator[0x16])(this);
    if (iVar4 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_SET_DESTDIR is set to ON but the \'");
      poVar5 = std::operator<<(poVar5,(string *)&this->Name);
      poVar5 = std::operator<<(poVar5,"\' generator does NOT support it.");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x44,_ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      return 0;
    }
    iVar4 = (*this->_vptr_cmCPackGenerator[0x16])(this);
    if (iVar4 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_SET_DESTDIR is set to ON but it is ");
      poVar5 = std::operator<<(poVar5,"usually a bad idea to do that with \'");
      poVar5 = std::operator<<(poVar5,(string *)&this->Name);
      poVar5 = std::operator<<(poVar5,"\' generator. Use at your own risk.");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4b,_ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg_10,"CPACK_PACKAGE_DIRECTORY",(allocator<char> *)&topDirectory
            );
  psVar6 = (string *)GetOption(this,(string *)&cmCPackLog_msg_10);
  if (psVar6 == (string *)0x0) {
    psVar6 = &cmValue::Empty_abi_cxx11_;
  }
  _cmCPackLog_msg = (pointer)psVar6->_M_string_length;
  _ostr = &DAT_00000011;
  cmStrCat<>(&tempDirectory,(cmAlphaNum *)&cmCPackLog_msg,(cmAlphaNum *)&ostr);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_TAG",(allocator<char> *)&ostr);
  cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (cVar7.Value != (string *)0x0) {
    std::__cxx11::string::append((string *)&tempDirectory);
    std::__cxx11::string::append((char *)&tempDirectory);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_GENERATOR",(allocator<char> *)&ostr);
  GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::append((string *)&tempDirectory);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&topDirectory,(string *)&tempDirectory);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_FILE_NAME",(allocator<char> *)&ostr);
  cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"CPACK_PACKAGE_FILE_NAME not specified");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x5b,_ostr);
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    iVar4 = 0;
    goto LAB_0015440e;
  }
  std::__cxx11::string::string((string *)&outName,(string *)cVar7.Value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&outName);
  std::__cxx11::string::append((string *)&tempDirectory);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  iVar4 = (*this->_vptr_cmCPackGenerator[4])(this);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"No output extension specified");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x62,_ostr);
LAB_00154130:
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    iVar4 = 0;
  }
  else {
    (*this->_vptr_cmCPackGenerator[4])(this);
    std::__cxx11::string::append((char *)&outName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DIRECTORY",(allocator<char> *)&ostr);
    cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"CPACK_PACKAGE_DIRECTORY not specified");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x69,_ostr);
      goto LAB_00154130;
    }
    std::__cxx11::string::string((string *)&destFile,(string *)cVar7.Value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PREFIX",(allocator<char> *)&ostr);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,&destFile);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,"/",&outName);
    std::__cxx11::string::append((string *)&destFile);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&topDirectory,"/");
    std::operator+(&outFile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cmCPackLog_msg,&outName);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator<char> *)&ostr);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,&topDirectory);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&ostr);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,&tempDirectory);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_NAME",(allocator<char> *)&ostr);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,&outName);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PATH",(allocator<char> *)&ostr);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,&destFile);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
               (allocator<char> *)&ostr);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,&outFile);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_INSTALL_DIRECTORY",(allocator<char> *)&ostr);
    iVar4 = (*this->_vptr_cmCPackGenerator[10])(this);
    StoreOptionIfNotSet<char_const*>
              (this,(string *)&cmCPackLog_msg,(char *)CONCAT44(extraout_var_00,iVar4));
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NATIVE_INSTALL_DIRECTORY",(allocator<char> *)&line);
    iVar4 = (*this->_vptr_cmCPackGenerator[10])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_10,(char *)CONCAT44(extraout_var_01,iVar4),
               (allocator<char> *)local_608);
    cmsys::SystemTools::ConvertToOutputPath((string *)&ostr,(string *)&cmCPackLog_msg_10);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,(string *)&ostr);
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_INSTALL_DIRECTORY",
               (allocator<char> *)&ostr);
    StoreOptionIfNotSet<cmValue>(this,(string *)&cmCPackLog_msg,&tempDirectory);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Look for: CPACK_PACKAGE_DESCRIPTION_FILE");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x7d,_ostr);
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DESCRIPTION_FILE",(allocator<char> *)&ostr);
    cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (cVar7.Value == (string *)0x0) {
LAB_00153f2b:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DESCRIPTION",(allocator<char> *)&ostr);
      cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (cVar7.Value == (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "Project description not specified. Please specify CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
                                );
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xa3,_ostr);
LAB_001543ce:
        std::__cxx11::string::~string((string *)&ostr);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        iVar4 = 0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_CHECKSUM",(allocator<char> *)&ostr);
        cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        if (cVar7.Value != (string *)0x0) {
          algo._M_str = (char *)(cVar7.Value)->_M_string_length;
          algo._M_len = (size_t)&cmCPackLog_msg;
          cmCryptoHash::New(algo);
          _Var2._M_p = _cmCPackLog_msg;
          std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                    ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)&cmCPackLog_msg
                    );
          if (_Var2._M_p == (pointer)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot recognize algorithm: ");
            poVar5 = operator<<(poVar5,cVar7);
            std::endl<char,std::char_traits<char>>(poVar5);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0xab,_ostr);
            goto LAB_001543ce;
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",
                   (allocator<char> *)&ostr);
        StoreOptionIfNotSet<char_const*>(this,(string *)&cmCPackLog_msg,"1");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        iVar4 = 1;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DESCRIPTION",(allocator<char> *)&ostr);
      cVar8 = GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (cVar8.Value != (string *)0x0) goto LAB_00153f2b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Look for: ");
      poVar5 = operator<<(poVar5,cVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x81,_ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      bVar3 = cmsys::SystemTools::FileExists(cVar7.Value);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot find description file name: [");
        poVar5 = operator<<(poVar5,cVar7);
        poVar5 = std::operator<<(poVar5,"]");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x85,_ostr);
        goto LAB_001543ce;
      }
      std::ifstream::ifstream(&cmCPackLog_msg,((cVar7.Value)->_M_dataplus)._M_p,_S_in);
      uVar9 = *(uint *)((long)auStack_5a8 + *(long *)(_cmCPackLog_msg + -0x18));
      if ((uVar9 & 5) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_10);
        local_60c = uVar9;
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_10,"Read description file: ");
        poVar5 = operator<<(poVar5,cVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x93,local_608[0]);
        std::__cxx11::string::~string((string *)local_608);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_10);
        while (((*(byte *)((long)auStack_5a8 + *(long *)(_cmCPackLog_msg + -0x18)) & 5) == 0 &&
               (bVar3 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&cmCPackLog_msg,&line,(bool *)0x0,0xffffffffffffffff),
               bVar3))) {
          cmXMLSafe::cmXMLSafe((cmXMLSafe *)&cmCPackLog_msg_10,&line);
          poVar5 = operator<<((ostream *)&ostr,(cmXMLSafe *)&cmCPackLog_msg_10);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg_10,"CPACK_PACKAGE_DESCRIPTION",&local_60d);
        std::__cxx11::stringbuf::str();
        StoreOption<cmValue>(this,(string *)&cmCPackLog_msg_10,(string *)local_608);
        std::__cxx11::string::~string((string *)local_608);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg_10,"CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE",
                   (allocator<char> *)local_608);
        cVar8 = GetOption(this,(string *)&cmCPackLog_msg_10);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
        if ((cVar8.Value != (string *)0x0) && (bVar3 = ::operator==(cVar8,cVar7), bVar3)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg_10,"CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE",
                     (allocator<char> *)local_608);
          StoreOption<char_const*>(this,(string *)&cmCPackLog_msg_10,"ON");
          std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
        }
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
        uVar9 = local_60c;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
        poVar5 = std::operator<<((ostream *)&ostr,"Cannot open description file name: ");
        poVar5 = operator<<(poVar5,cVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x8c,_cmCPackLog_msg_10);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
      }
      std::ifstream::~ifstream(&cmCPackLog_msg);
      iVar4 = 0;
      if ((uVar9 & 5) == 0) goto LAB_00153f2b;
    }
    std::__cxx11::string::~string((string *)&outFile);
    std::__cxx11::string::~string((string *)&destFile);
  }
  std::__cxx11::string::~string((string *)&outName);
LAB_0015440e:
  std::__cxx11::string::~string((string *)&topDirectory);
  std::__cxx11::string::~string((string *)&tempDirectory);
  return iVar4;
}

Assistant:

int cmCPackGenerator::PrepareNames()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Create temp directory." << std::endl);

  // checks CPACK_SET_DESTDIR support
  if (this->IsOn("CPACK_SET_DESTDIR")) {
    if (SETDESTDIR_UNSUPPORTED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_SET_DESTDIR is set to ON but the '"
                      << this->Name << "' generator does NOT support it."
                      << std::endl);
      return 0;
    }
    if (SETDESTDIR_SHOULD_NOT_BE_USED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_WARNING,
                    "CPACK_SET_DESTDIR is set to ON but it is "
                      << "usually a bad idea to do that with '" << this->Name
                      << "' generator. Use at your own risk." << std::endl);
    }
  }

  std::string tempDirectory =
    cmStrCat(this->GetOption("CPACK_PACKAGE_DIRECTORY"), "/_CPack_Packages/");
  cmValue toplevelTag = this->GetOption("CPACK_TOPLEVEL_TAG");
  if (toplevelTag) {
    tempDirectory += *toplevelTag;
    tempDirectory += "/";
  }
  tempDirectory += *this->GetOption("CPACK_GENERATOR");
  std::string topDirectory = tempDirectory;
  cmValue pfname = this->GetOption("CPACK_PACKAGE_FILE_NAME");
  if (!pfname) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_FILE_NAME not specified" << std::endl);
    return 0;
  }
  std::string outName = pfname;
  tempDirectory += "/" + outName;
  if (!this->GetOutputExtension()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "No output extension specified" << std::endl);
    return 0;
  }
  outName += this->GetOutputExtension();
  cmValue pdir = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  if (!pdir) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_DIRECTORY not specified" << std::endl);
    return 0;
  }

  std::string destFile = pdir;
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PREFIX", destFile);
  destFile += "/" + outName;
  std::string outFile = topDirectory + "/" + outName;
  this->SetOptionIfNotSet("CPACK_TOPLEVEL_DIRECTORY", topDirectory);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_DIRECTORY", tempDirectory);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_NAME", outName);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PATH", destFile);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_PACKAGE_FILE_NAME", outFile);
  this->SetOptionIfNotSet("CPACK_INSTALL_DIRECTORY", this->GetInstallPath());
  this->SetOptionIfNotSet(
    "CPACK_NATIVE_INSTALL_DIRECTORY",
    cmsys::SystemTools::ConvertToOutputPath(this->GetInstallPath()));
  this->SetOptionIfNotSet("CPACK_TEMPORARY_INSTALL_DIRECTORY", tempDirectory);

  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Look for: CPACK_PACKAGE_DESCRIPTION_FILE" << std::endl);
  cmValue descFileName = this->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if (descFileName && !this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Look for: " << descFileName << std::endl);
    if (!cmSystemTools::FileExists(descFileName)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot find description file name: ["
                      << descFileName << "]" << std::endl);
      return 0;
    }
    cmsys::ifstream ifs(descFileName->c_str());
    if (!ifs) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot open description file name: " << descFileName
                                                          << std::endl);
      return 0;
    }
    std::ostringstream ostr;
    std::string line;

    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Read description file: " << descFileName << std::endl);
    while (ifs && cmSystemTools::GetLineFromStream(ifs, line)) {
      ostr << cmXMLSafe(line) << std::endl;
    }
    this->SetOption("CPACK_PACKAGE_DESCRIPTION", ostr.str());
    cmValue defFileName =
      this->GetOption("CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE");
    if (defFileName && (defFileName == descFileName)) {
      this->SetOption("CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE", "ON");
    }
  }
  if (!this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "Project description not specified. Please specify "
      "CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
        << std::endl);
    return 0;
  }
  cmValue algoSignature = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  if (algoSignature) {
    if (!cmCryptoHash::New(*algoSignature)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot recognize algorithm: " << algoSignature
                                                   << std::endl);
      return 0;
    }
  }

  this->SetOptionIfNotSet("CPACK_REMOVE_TOPLEVEL_DIRECTORY", "1");

  return 1;
}